

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale_tools.h
# Opt level: O1

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
to_correct_string<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,string *e,locale *param_2)

{
  char *pcVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"UTF-8","");
  pcVar1 = (e->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)__return_storage_ptr__,pcVar1,(string *)(pcVar1 + e->_M_string_length),
             (method_type)(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> to_correct_string(std::string const &e,std::locale /*l*/)
{
    return booster::locale::conv::to_utf<Char>(e,"UTF-8");
}